

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall TextReaderTest_ReadInt_Test::TestBody(TextReaderTest_ReadInt_Test *this)

{
  bool bVar1;
  char *pcVar2;
  NLStringRef data;
  AssertHelper local_a8;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  TextReader reader;
  
  data.size_ = 0xb;
  data.data_ = "  11   -22 ";
  mp::internal::TextReader<fmt::Locale>::TextReader(&reader,data,(CStringRef)0x22c559);
  gtest_ar_2._0_4_ = 0xb;
  local_a8.data_._0_4_ = mp::internal::TextReader<fmt::Locale>::ReadInt<int>(&reader);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"11","reader.ReadInt<int>()",(int *)&gtest_ar_2,(int *)&local_a8)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x83,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.data_._0_4_ = 0xffffffea;
  gtest_ar_2._0_8_ = mp::internal::TextReader<fmt::Locale>::ReadInt<long>(&reader);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&gtest_ar,"-22","reader.ReadInt<long>()",(int *)&local_a8,
             (long *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x84,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar_2.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar,"test:1:12: expected integer",(allocator<char> *)&local_a8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::TextReader<fmt::Locale>::ReadInt<int>(&reader);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_2,
               (char (*) [104])
               "Expected: reader.ReadInt<int>() throws an exception of type mp::ReadError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  if (gtest_ar_2.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x86,pcVar2);
  testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  mp::internal::TextReader<fmt::Locale>::~TextReader(&reader);
  return;
}

Assistant:

TEST(TextReaderTest, ReadInt) {
  TextReader reader("  11   -22 ", "test");
  EXPECT_EQ(11, reader.ReadInt<int>());
  EXPECT_EQ(-22, reader.ReadInt<long>());
  EXPECT_THROW_MSG(reader.ReadInt<int>(), mp::ReadError,
                   "test:1:12: expected integer");
}